

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_test_fixture.cpp
# Opt level: O1

void __thiscall
wallet::InitWalletDirTestingSetup::~InitWalletDirTestingSetup(InitWalletDirTestingSetup *this)

{
  long lVar1;
  WalletLoader *pWVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::current_path(&(this->m_cwd).super_path);
  pWVar2 = (this->m_wallet_loader)._M_t.
           super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
           ._M_t.
           super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
           .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl;
  if (pWVar2 != (WalletLoader *)0x0) {
    (*(pWVar2->super_ChainClient)._vptr_ChainClient[1])();
  }
  (this->m_wallet_loader)._M_t.
  super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>.
  _M_t.
  super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
  .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl = (WalletLoader *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::~_Rb_tree(&(this->m_walletdir_path_cases)._M_t);
  std::filesystem::__cxx11::path::~path(&(this->m_cwd).super_path);
  std::filesystem::__cxx11::path::~path(&(this->m_datadir).super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    BasicTestingSetup::~BasicTestingSetup(&this->super_BasicTestingSetup);
    return;
  }
  __stack_chk_fail();
}

Assistant:

InitWalletDirTestingSetup::~InitWalletDirTestingSetup()
{
    fs::current_path(m_cwd);
}